

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lyb.c
# Opt level: O1

uint8_t lyb_get_hash(lysc_node *node,uint8_t collision_id)

{
  uint8_t uVar1;
  
  if (node->hash[0] == '\0') {
    __assert_fail("node->hash[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/lyb.c",
                  0x46,"uint8_t lyb_get_hash(const struct lysc_node *, uint8_t)");
  }
  if (collision_id < 4) {
    return node->hash[collision_id];
  }
  uVar1 = lyb_generate_hash(node,collision_id);
  return uVar1;
}

Assistant:

LYB_HASH
lyb_get_hash(const struct lysc_node *node, uint8_t collision_id)
{
    /* hashes must be cached */
    assert(node->hash[0]);

    if (collision_id < LYS_NODE_HASH_COUNT) {
        /* read from cache */
        return node->hash[collision_id];
    }

    /* generate */
    return lyb_generate_hash(node, collision_id);
}